

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlog.cxx
# Opt level: O3

void zpsoe::zlog::open_log_file(FILE **file)

{
  int iVar1;
  FILE *pFVar2;
  long *plVar3;
  ostream *poVar4;
  size_type *psVar5;
  char *__modes;
  stat buf_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  stat local_a0;
  
  iVar1 = stat(DAT_0010a500,&local_a0);
  if (iVar1 != 0) {
    local_a0.st_size = 0;
  }
  __modes = "wb";
  if ((ulong)local_a0.st_size < DAT_0010a4f8) {
    __modes = "ab+";
  }
  pFVar2 = fopen(DAT_0010a500,__modes);
  *file = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    std::operator+(&local_c0,"cannot open \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &DAT_0010a500);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_c0);
    local_100._M_dataplus._M_p = (pointer)*plVar3;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_100._M_dataplus._M_p == psVar5) {
      local_100.field_2._M_allocated_capacity = *psVar5;
      local_100.field_2._8_8_ = plVar3[3];
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar5;
    }
    local_100._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    errno_to_str_abi_cxx11_();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
                   &local_100,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_a0.st_dev,local_a0.st_ino);
    std::endl<char,std::char_traits<char>>(poVar4);
    exit(1);
  }
  return;
}

Assistant:

void open_log_file(FILE **file) {
  const size_t old_log_size_ = get_size_in_byte(G_LogConfig.path);

  if (old_log_size_ >= G_LogConfig.max_byte)
    // 覆盖
    *file = fopen(G_LogConfig.path.c_str(), "wb");
  else
    // 追加
    *file = fopen(G_LogConfig.path.c_str(), "ab+");

  if (*file == NULL) {
    const string err_("cannot open \"" + G_LogConfig.path + "\": " + errno_to_str());
    cerr << err_ << endl;
    exit(EXIT_FAILURE);
  }
}